

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

Var Js::TypedArrayBase::EntryGetterSymbolToStringTag
              (RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  BOOL BVar3;
  ScriptContext *pSVar4;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar5;
  Var pvVar6;
  ScriptConfiguration *this_00;
  JavascriptLibrary *pJVar7;
  RecyclableObject *pRVar8;
  PropertyString *local_70;
  Var name;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  TypeId local_18;
  TypeId typeId;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x472,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0x475,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (((ulong)scriptContext & 0xffffff) != 0) {
    pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,0);
    bVar2 = VarIs<Js::TypedArrayBase>(pvVar6);
    if (bVar2) {
      pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,0);
      if (pvVar6 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      bVar2 = TaggedInt::Is(pvVar6);
      if (bVar2) {
        local_18 = TypeIds_FirstNumberType;
      }
      else {
        bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(pvVar6);
        if (bVar2) {
          local_18 = TypeIds_Number;
        }
        else {
          pRVar8 = UnsafeVarTo<Js::RecyclableObject>(pvVar6);
          if (pRVar8 == (RecyclableObject *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
          local_18 = RecyclableObject::GetTypeId(pRVar8);
          if ((0x57 < (int)local_18) && (BVar3 = RecyclableObject::IsExternal(pRVar8), BVar3 == 0))
          {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 1;
            bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar5 = 0;
          }
        }
      }
      switch(local_18) {
      case TypeIds_Int8Array:
        local_70 = ScriptContext::GetPropertyString(pSVar4,0x1ad);
        break;
      case TypeIds_Uint8Array:
        local_70 = ScriptContext::GetPropertyString(pSVar4,0x1b0);
        break;
      case TypeIds_Uint8ClampedArray:
        local_70 = ScriptContext::GetPropertyString(pSVar4,0x1b1);
        break;
      case TypeIds_Int16Array:
        local_70 = ScriptContext::GetPropertyString(pSVar4,0x1ae);
        break;
      case TypeIds_Uint16Array:
        local_70 = ScriptContext::GetPropertyString(pSVar4,0x1b2);
        break;
      case TypeIds_Int32Array:
        local_70 = ScriptContext::GetPropertyString(pSVar4,0x1af);
        break;
      case TypeIds_Uint32Array:
        local_70 = ScriptContext::GetPropertyString(pSVar4,0x1b3);
        break;
      case TypeIds_Float32Array:
        local_70 = ScriptContext::GetPropertyString(pSVar4,0x1b4);
        break;
      case TypeIds_Float64Array:
        local_70 = ScriptContext::GetPropertyString(pSVar4,0x1b5);
        break;
      default:
        pJVar7 = ScriptContext::GetLibrary(pSVar4);
        local_70 = (PropertyString *)JavascriptLibrary::GetUndefinedDisplayString(pJVar7);
      }
      return local_70;
    }
  }
  this_00 = ScriptContext::GetConfig(pSVar4);
  bVar2 = ScriptConfiguration::IsES6ToStringTagEnabled(this_00);
  if (bVar2) {
    pJVar7 = ScriptContext::GetLibrary(pSVar4);
    pRVar8 = JavascriptLibraryBase::GetUndefined(&pJVar7->super_JavascriptLibraryBase);
    return pRVar8;
  }
  JavascriptError::ThrowTypeError(pSVar4,-0x7ff5ec25,(PCWSTR)0x0);
}

Assistant:

Var TypedArrayBase::EntryGetterSymbolToStringTag(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        // 1. Let O be the this value.
        // 2. If Type(O) is not Object, return undefined.
        // 3. If O does not have a[[TypedArrayName]] internal slot, return undefined.
        if (args.Info.Count == 0 || !VarIs<TypedArrayBase>(args[0]))
        {
            if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
            {
                return scriptContext->GetLibrary()->GetUndefined();
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedTypedArray);
            }
        }

        // 4. Let name be O.[[TypedArrayName]].
        // 5. Assert: name is a String value.
        // 6. Return name.
        Var name;
        switch (JavascriptOperators::GetTypeId(args[0]))
        {
        case TypeIds_Int8Array:
            name = scriptContext->GetPropertyString(PropertyIds::Int8Array);
            break;

        case TypeIds_Uint8Array:
            name = scriptContext->GetPropertyString(PropertyIds::Uint8Array);
            break;

        case TypeIds_Uint8ClampedArray:
            name = scriptContext->GetPropertyString(PropertyIds::Uint8ClampedArray);
            break;

        case TypeIds_Int16Array:
            name = scriptContext->GetPropertyString(PropertyIds::Int16Array);
            break;

        case TypeIds_Uint16Array:
            name = scriptContext->GetPropertyString(PropertyIds::Uint16Array);
            break;

        case TypeIds_Int32Array:
            name = scriptContext->GetPropertyString(PropertyIds::Int32Array);
            break;

        case TypeIds_Uint32Array:
            name = scriptContext->GetPropertyString(PropertyIds::Uint32Array);
            break;

        case TypeIds_Float32Array:
            name = scriptContext->GetPropertyString(PropertyIds::Float32Array);
            break;

        case TypeIds_Float64Array:
            name = scriptContext->GetPropertyString(PropertyIds::Float64Array);
            break;

        default:
            name = scriptContext->GetLibrary()->GetUndefinedDisplayString();
            break;
        }

        return name;
    }